

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.h
# Opt level: O0

uint32_t qemu_xxhash7(uint64_t ab,uint64_t cd,uint32_t e,uint32_t f,uint32_t g)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint uVar5;
  uint32_t h32;
  uint32_t d;
  uint32_t c;
  uint32_t b;
  uint32_t a;
  uint32_t v4;
  uint32_t v3;
  uint32_t v2;
  uint32_t v1;
  uint32_t g_local;
  uint32_t f_local;
  uint32_t e_local;
  uint64_t cd_local;
  uint64_t ab_local;
  
  uVar1 = rol32((int)ab * -0x7a143589 + 0x24234429,0xd);
  uVar2 = rol32((int)(ab >> 0x20) * -0x7a143589 + 0x85ebca78,0xd);
  uVar3 = rol32((int)cd * -0x7a143589 + 1,0xd);
  uVar4 = rol32((int)(cd >> 0x20) * -0x7a143589 + 0x61c88650,0xd);
  uVar1 = rol32(uVar1 * -0x61c8864f,1);
  uVar2 = rol32(uVar2 * -0x61c8864f,7);
  uVar3 = rol32(uVar3 * -0x61c8864f,0xc);
  uVar4 = rol32(uVar4 * -0x61c8864f,0x12);
  uVar1 = rol32(e * -0x3d4d51c3 + uVar1 + uVar2 + uVar3 + uVar4 + 0x1c,0x11);
  uVar1 = rol32(f * -0x3d4d51c3 + uVar1 * 0x27d4eb2f,0x11);
  uVar1 = rol32(g * -0x3d4d51c3 + uVar1 * 0x27d4eb2f,0x11);
  uVar5 = (uVar1 * 0x27d4eb2f >> 0xf ^ uVar1 * 0x27d4eb2f) * -0x7a143589;
  uVar5 = (uVar5 >> 0xd ^ uVar5) * -0x3d4d51c3;
  return uVar5 >> 0x10 ^ uVar5;
}

Assistant:

static inline uint32_t
qemu_xxhash7(uint64_t ab, uint64_t cd, uint32_t e, uint32_t f, uint32_t g)
{
#ifdef _WIN32
    uint64_t v1x = QEMU_XXHASH_SEED;
    v1x += PRIME32_1;
    v1x += PRIME32_2;
    uint32_t v1 = v1x;
#else
    uint32_t v1 = QEMU_XXHASH_SEED + PRIME32_1 + PRIME32_2;
#endif
    uint32_t v2 = QEMU_XXHASH_SEED + PRIME32_2;
    uint32_t v3 = QEMU_XXHASH_SEED + 0;
    uint32_t v4 = QEMU_XXHASH_SEED - PRIME32_1;
    uint32_t a = ab;
    uint32_t b = ab >> 32;
    uint32_t c = cd;
    uint32_t d = cd >> 32;
    uint32_t h32;

    v1 += a * PRIME32_2;
    v1 = rol32(v1, 13);
    v1 *= PRIME32_1;

    v2 += b * PRIME32_2;
    v2 = rol32(v2, 13);
    v2 *= PRIME32_1;

    v3 += c * PRIME32_2;
    v3 = rol32(v3, 13);
    v3 *= PRIME32_1;

    v4 += d * PRIME32_2;
    v4 = rol32(v4, 13);
    v4 *= PRIME32_1;

    h32 = rol32(v1, 1) + rol32(v2, 7) + rol32(v3, 12) + rol32(v4, 18);
    h32 += 28;

    h32 += e * PRIME32_3;
    h32  = rol32(h32, 17) * PRIME32_4;

    h32 += f * PRIME32_3;
    h32  = rol32(h32, 17) * PRIME32_4;

    h32 += g * PRIME32_3;
    h32  = rol32(h32, 17) * PRIME32_4;

    h32 ^= h32 >> 15;
    h32 *= PRIME32_2;
    h32 ^= h32 >> 13;
    h32 *= PRIME32_3;
    h32 ^= h32 >> 16;

    return h32;
}